

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOrderDirectories.cxx
# Opt level: O1

void __thiscall
cmOrderDirectoriesConstraint::cmOrderDirectoriesConstraint
          (cmOrderDirectoriesConstraint *this,cmOrderDirectories *od,string *file)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  bool bVar3;
  int iVar4;
  long lVar5;
  bool bVar6;
  string local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_80;
  string *local_78;
  undefined1 *local_70;
  undefined8 local_68;
  undefined1 local_60;
  undefined7 uStack_5f;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40;
  undefined7 uStack_3f;
  
  this->_vptr_cmOrderDirectoriesConstraint =
       (_func_int **)&PTR__cmOrderDirectoriesConstraint_006aa500;
  this->OD = od;
  this->GlobalGenerator = od->GlobalGenerator;
  local_78 = &this->FullPath;
  local_80 = &(this->FullPath).field_2;
  (this->FullPath)._M_dataplus._M_p = (pointer)local_80;
  (this->FullPath)._M_string_length = 0;
  (this->FullPath).field_2._M_local_buf[0] = '\0';
  (this->Directory)._M_dataplus._M_p = (pointer)&(this->Directory).field_2;
  (this->Directory)._M_string_length = 0;
  (this->Directory).field_2._M_local_buf[0] = '\0';
  (this->FileName)._M_dataplus._M_p = (pointer)&(this->FileName).field_2;
  (this->FileName)._M_string_length = 0;
  (this->FileName).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_assign((string *)local_78);
  lVar5 = std::__cxx11::string::rfind((char *)file,0x54e981,0xffffffffffffffff);
  if (lVar5 != -1) {
    if (cmOrderDirectoriesConstraint(cmOrderDirectories*,std::__cxx11::string_const&)::
        splitFramework == '\0') {
      iVar4 = __cxa_guard_acquire(&cmOrderDirectoriesConstraint(cmOrderDirectories*,std::__cxx11::string_const&)
                                   ::splitFramework);
      if (iVar4 != 0) {
        cmOrderDirectoriesConstraint::splitFramework.regmatch.startp[0] = (char *)0x0;
        cmOrderDirectoriesConstraint::splitFramework.regmatch.endp[0] = (char *)0x0;
        cmOrderDirectoriesConstraint::splitFramework.regmatch.searchstring = (char *)0x0;
        cmOrderDirectoriesConstraint::splitFramework.program = (char *)0x0;
        cmsys::RegularExpression::compile
                  (&cmOrderDirectoriesConstraint::splitFramework,"^(.*)/(.*).framework/(.*)$");
        __cxa_atexit(cmsys::RegularExpression::~RegularExpression,
                     &cmOrderDirectoriesConstraint::splitFramework,&__dso_handle);
        __cxa_guard_release(&cmOrderDirectoriesConstraint(cmOrderDirectories*,std::__cxx11::string_const&)
                             ::splitFramework);
      }
    }
    bVar3 = cmsys::RegularExpression::find
                      (&cmOrderDirectoriesConstraint::splitFramework,(file->_M_dataplus)._M_p,
                       &cmOrderDirectoriesConstraint::splitFramework.regmatch);
    if (bVar3) {
      if (cmOrderDirectoriesConstraint::splitFramework.regmatch.startp[3] == (char *)0x0) {
        local_70 = &local_60;
        local_68 = 0;
        local_60 = 0;
      }
      else {
        local_70 = &local_60;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_70,
                   cmOrderDirectoriesConstraint::splitFramework.regmatch.startp[3],
                   cmOrderDirectoriesConstraint::splitFramework.regmatch.endp[3]);
      }
      if (cmOrderDirectoriesConstraint::splitFramework.regmatch.startp[2] == (char *)0x0) {
        local_50 = &local_40;
        local_48 = 0;
        local_40 = 0;
      }
      else {
        local_50 = &local_40;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_50,
                   cmOrderDirectoriesConstraint::splitFramework.regmatch.startp[2],
                   cmOrderDirectoriesConstraint::splitFramework.regmatch.endp[2]);
      }
      lVar5 = std::__cxx11::string::find((char *)&local_70,(ulong)local_50,0);
      bVar6 = lVar5 != -1;
    }
    else {
      bVar6 = false;
    }
    if (bVar3) {
      if (local_50 != &local_40) {
        operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
      }
      if (local_70 != &local_60) {
        operator_delete(local_70,CONCAT71(uStack_5f,local_60) + 1);
      }
    }
    if (bVar6) {
      if (cmOrderDirectoriesConstraint::splitFramework.regmatch.startp[1] == (char *)0x0) {
        local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
        local_a0._M_string_length = 0;
        local_a0.field_2._M_local_buf[0] = '\0';
      }
      else {
        local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_a0,
                   cmOrderDirectoriesConstraint::splitFramework.regmatch.startp[1],
                   cmOrderDirectoriesConstraint::splitFramework.regmatch.endp[1]);
      }
      std::__cxx11::string::operator=((string *)&this->Directory,(string *)&local_a0);
      paVar1 = &local_a0.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != paVar1) {
        operator_delete(local_a0._M_dataplus._M_p,
                        CONCAT71(local_a0.field_2._M_allocated_capacity._1_7_,
                                 local_a0.field_2._M_local_buf[0]) + 1);
      }
      pcVar2 = (file->_M_dataplus)._M_p;
      local_a0._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::
      _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                ((string *)&local_a0,pcVar2 + (this->Directory)._M_string_length + 1,
                 pcVar2 + file->_M_string_length);
      std::__cxx11::string::operator=((string *)&this->FileName,(string *)&local_a0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != paVar1) {
        operator_delete(local_a0._M_dataplus._M_p,
                        CONCAT71(local_a0.field_2._M_allocated_capacity._1_7_,
                                 local_a0.field_2._M_local_buf[0]) + 1);
      }
    }
  }
  if ((this->FileName)._M_string_length == 0) {
    cmsys::SystemTools::GetFilenamePath(&local_a0,file);
    std::__cxx11::string::operator=((string *)&this->Directory,(string *)&local_a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p,
                      CONCAT71(local_a0.field_2._M_allocated_capacity._1_7_,
                               local_a0.field_2._M_local_buf[0]) + 1);
    }
    cmsys::SystemTools::GetFilenameName(&local_a0,file);
    std::__cxx11::string::operator=((string *)&this->FileName,(string *)&local_a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p,
                      CONCAT71(local_a0.field_2._M_allocated_capacity._1_7_,
                               local_a0.field_2._M_local_buf[0]) + 1);
    }
  }
  return;
}

Assistant:

cmOrderDirectoriesConstraint(cmOrderDirectories* od, std::string const& file)
    : OD(od)
    , GlobalGenerator(od->GlobalGenerator)
  {
    this->FullPath = file;

    if (file.rfind(".framework") != std::string::npos) {
      static cmsys::RegularExpression splitFramework(
        "^(.*)/(.*).framework/(.*)$");
      if (splitFramework.find(file) &&
          (std::string::npos !=
           splitFramework.match(3).find(splitFramework.match(2)))) {
        this->Directory = splitFramework.match(1);
        this->FileName =
          std::string(file.begin() + this->Directory.size() + 1, file.end());
      }
    }

    if (this->FileName.empty()) {
      this->Directory = cmSystemTools::GetFilenamePath(file);
      this->FileName = cmSystemTools::GetFilenameName(file);
    }
  }